

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcalc.c
# Opt level: O1

FT_Long FT_MulDiv_No_Round(FT_Long a_,FT_Long b_,FT_Long c_)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  if (c_ == 0) {
    uVar2 = 0x7fffffff;
  }
  else {
    uVar2 = -c_;
    if (0 < c_) {
      uVar2 = c_;
    }
    lVar5 = -b_;
    if (0 < b_) {
      lVar5 = b_;
    }
    lVar1 = -a_;
    if (0 < a_) {
      lVar1 = a_;
    }
    uVar2 = (ulong)(lVar1 * lVar5) / uVar2;
  }
  uVar6 = (uint)(a_ >> 0x3f) | 1;
  uVar4 = -uVar6;
  if (-1 < b_) {
    uVar4 = uVar6;
  }
  uVar6 = -uVar4;
  if (-1 < c_) {
    uVar6 = uVar4;
  }
  uVar3 = -uVar2;
  if (-1 < (int)uVar6) {
    uVar3 = uVar2;
  }
  return uVar3;
}

Assistant:

FT_BASE_DEF( FT_Long )
  FT_MulDiv_No_Round( FT_Long  a_,
                      FT_Long  b_,
                      FT_Long  c_ )
  {
    FT_Int     s = 1;
    FT_UInt64  a, b, c, d;
    FT_Long    d_;


    a = (FT_UInt64)a_;
    b = (FT_UInt64)b_;
    c = (FT_UInt64)c_;

    FT_MOVE_SIGN( a_, a, s );
    FT_MOVE_SIGN( b_, b, s );
    FT_MOVE_SIGN( c_, c, s );

    d = c > 0 ? a * b / c
              : 0x7FFFFFFFUL;

    d_ = (FT_Long)d;

    return s < 0 ? NEG_LONG( d_ ) : d_;
  }